

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaBalLut.c
# Opt level: O0

int Bal_ManSetGateLevel(Bal_Man_t *p,Gia_Obj_t *pObjOld,int iLitNew)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int i;
  int fCompl1_00;
  int a;
  int b;
  int iVar4;
  int fIsXor;
  Gia_Obj_t *pObj;
  int local_90;
  int local_8c;
  int fMux;
  Gia_Obj_t *pObjNew;
  int iObjNew;
  int DelayMax;
  int Delay2;
  int Delay1;
  int Delay0;
  int fUnit2;
  int fUnit1;
  int fUnit0;
  int fCompl2;
  int fCompl1;
  int fCompl0;
  int Cost;
  int iFan2;
  int iFan1;
  int iFan0;
  int iLitNew_local;
  Gia_Obj_t *pObjOld_local;
  Bal_Man_t *p_local;
  
  iVar1 = Abc_Lit2Var(iLitNew);
  pObj = Gia_ManObj(p->pNew,iVar1);
  iVar2 = Gia_ObjIsMux(p->pNew,pObj);
  iVar3 = Vec_PtrSize(p->vCutSets);
  if (iVar1 < iVar3) {
    p_local._4_4_ = -1;
  }
  else {
    iVar3 = Gia_ObjFaninId0(pObj,iVar1);
    i = Gia_ObjFaninId1(pObj,iVar1);
    if (iVar2 == 0) {
      local_8c = 0;
    }
    else {
      local_8c = Gia_ObjFaninId2(p->pNew,iVar1);
    }
    iVar1 = Gia_ObjFaninC0(pObj);
    fCompl1_00 = Gia_ObjFaninC1(pObj);
    if (iVar2 == 0) {
      local_90 = 0;
    }
    else {
      local_90 = Gia_ObjFaninC2(p->pNew,pObj);
    }
    iVar2 = Bal_ObjDelay(p,iVar3);
    a = Bal_ObjDelay(p,i);
    b = Bal_ObjDelay(p,local_8c);
    iVar4 = Abc_MaxInt(a,b);
    iVar4 = Abc_MaxInt(iVar2,iVar4);
    if (0 < iVar4) {
      fIsXor = Gia_ObjIsXor(pObj);
      iVar2 = Bal_ManDeriveCuts(p,iVar3,i,local_8c,iVar1,fCompl1_00,local_90,(uint)(iVar2 != iVar4),
                                (uint)(a != iVar4),(uint)(b != iVar4),fIsXor,iVar4,1);
      if (-1 < iVar2) {
        return iVar2;
      }
    }
    iVar2 = Gia_ObjIsXor(pObj);
    p_local._4_4_ =
         Bal_ManDeriveCuts(p,iVar3,i,local_8c,iVar1,fCompl1_00,local_90,1,1,1,iVar2,iVar4 + 1,1);
    if (p_local._4_4_ < 0) {
      __assert_fail("Cost >= 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaBalLut.c"
                    ,0x20b,"int Bal_ManSetGateLevel(Bal_Man_t *, Gia_Obj_t *, int)");
    }
  }
  return p_local._4_4_;
}

Assistant:

int Bal_ManSetGateLevel( Bal_Man_t * p, Gia_Obj_t * pObjOld, int iLitNew )
{
    int iFan0, iFan1, iFan2, Cost;
    int fCompl0, fCompl1, fCompl2;
    int fUnit0, fUnit1, fUnit2;
    int Delay0, Delay1, Delay2, DelayMax;
    int iObjNew = Abc_Lit2Var(iLitNew);
    Gia_Obj_t * pObjNew = Gia_ManObj( p->pNew, iObjNew );
    int fMux = Gia_ObjIsMux(p->pNew, pObjNew);
    if ( iObjNew < Vec_PtrSize(p->vCutSets) )
        return -1;
    iFan0    = Gia_ObjFaninId0( pObjNew, iObjNew );
    iFan1    = Gia_ObjFaninId1( pObjNew, iObjNew );
    iFan2    = fMux ? Gia_ObjFaninId2(p->pNew, iObjNew) : 0;
    fCompl0  = Gia_ObjFaninC0( pObjNew );
    fCompl1  = Gia_ObjFaninC1( pObjNew );
    fCompl2  = fMux ? Gia_ObjFaninC2(p->pNew, pObjNew) : 0;
    Delay0   = Bal_ObjDelay( p, iFan0 );
    Delay1   = Bal_ObjDelay( p, iFan1 );
    Delay2   = Bal_ObjDelay( p, iFan2 );
    DelayMax = Abc_MaxInt( Delay0, Abc_MaxInt(Delay1, Delay2) );
    fUnit0   = (int)(Delay0 != DelayMax); 
    fUnit1   = (int)(Delay1 != DelayMax); 
    fUnit2   = (int)(Delay2 != DelayMax); 
    if ( DelayMax > 0 )
    {
//printf( "A" );
        Cost = Bal_ManDeriveCuts(p, iFan0, iFan1, iFan2, fCompl0, fCompl1, fCompl2, fUnit0, fUnit1, fUnit2, Gia_ObjIsXor(pObjNew), DelayMax, 1 );
//printf( "B" );
        if ( Cost >= 0 )
            return Cost;
    }
    DelayMax++;
    fUnit0 = fUnit1 = fUnit2 = 1;
//printf( "A" );
    Cost = Bal_ManDeriveCuts(p, iFan0, iFan1, iFan2, fCompl0, fCompl1, fCompl2, fUnit0, fUnit1, fUnit2, Gia_ObjIsXor(pObjNew), DelayMax, 1 );
//printf( "B" );
    assert( Cost >= 0 );
    return Cost;
}